

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth_pbuf.c
# Opt level: O2

csp_packet_t * csp_eth_pbuf_find(csp_eth_interface_data_t *ifdata,uint32_t id,int *task_woken)

{
  uint32_t now;
  csp_packet_t *pcVar1;
  csp_packet_t **ppcVar2;
  
  if (task_woken == (int *)0x0) {
    now = csp_get_ms();
  }
  else {
    now = csp_get_ms_isr();
  }
  ppcVar2 = &ifdata->pbufs;
  while( true ) {
    pcVar1 = *ppcVar2;
    if (pcVar1 == (csp_packet_t *)0x0) {
      pcVar1 = csp_eth_pbuf_new(ifdata,id,now,task_woken);
      return pcVar1;
    }
    if ((pcVar1->field_0).field_0.timestamp_rx == id) break;
    ppcVar2 = &pcVar1->next;
  }
  (pcVar1->field_0).field_1.last_used = now;
  return pcVar1;
}

Assistant:

csp_packet_t * csp_eth_pbuf_find(csp_eth_interface_data_t * ifdata, uint32_t id, int * task_woken) {

	uint32_t now = (task_woken) ? csp_get_ms_isr() : csp_get_ms();

	csp_packet_t * packet = ifdata->pbufs;
	while (packet) {

		if (packet->cfpid == id) {
			packet->last_used = now;
			return packet;
		}
		packet = packet->next;
	}

	return csp_eth_pbuf_new(ifdata, id, now, task_woken);

}